

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-run-once.c
# Opt level: O3

int run_test_run_once(void)

{
  int iVar1;
  int extraout_EAX;
  uv_loop_t *puVar2;
  uv_idle_t *handle;
  int64_t eval_b;
  int64_t eval_a;
  void *local_10;
  
  puVar2 = uv_default_loop();
  uv_idle_init(puVar2,&idle_handle);
  uv_idle_start(&idle_handle,idle_cb);
  do {
    puVar2 = uv_default_loop();
    iVar1 = uv_run(puVar2,UV_RUN_ONCE);
  } while (iVar1 != 0);
  local_10 = (void *)(long)idle_counter;
  if (local_10 == (void *)0x40) {
    puVar2 = uv_default_loop();
    uv_walk(puVar2,close_walk_cb,(void *)0x0);
    uv_run(puVar2,UV_RUN_DEFAULT);
    local_10 = (void *)0x0;
    puVar2 = uv_default_loop();
    iVar1 = uv_loop_close(puVar2);
    if (local_10 == (void *)(long)iVar1) {
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    run_test_run_once_cold_1();
  }
  handle = (uv_idle_t *)&stack0xfffffffffffffff0;
  run_test_run_once_cold_2();
  if (handle == &idle_handle) {
    idle_counter = idle_counter + 1;
    if (idle_counter == 0x40) {
      iVar1 = uv_idle_stop(&idle_handle);
      return iVar1;
    }
    return idle_counter;
  }
  idle_cb_cold_1();
  iVar1 = uv_is_closing((uv_handle_t *)handle);
  if (iVar1 != 0) {
    return iVar1;
  }
  uv_close((uv_handle_t *)handle,(uv_close_cb)0x0);
  return extraout_EAX;
}

Assistant:

TEST_IMPL(run_once) {
  uv_idle_init(uv_default_loop(), &idle_handle);
  uv_idle_start(&idle_handle, idle_cb);

  while (uv_run(uv_default_loop(), UV_RUN_ONCE));
  ASSERT_EQ(idle_counter, NUM_TICKS);

  MAKE_VALGRIND_HAPPY(uv_default_loop());
  return 0;
}